

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

void __thiscall icu_63::Edits::addUnchanged(Edits *this,int32_t unchangedLength)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t remaining;
  int32_t last;
  int32_t unchangedLength_local;
  Edits *this_local;
  
  UVar1 = ::U_FAILURE(this->errorCode_);
  if ((UVar1 == '\0') && (unchangedLength != 0)) {
    if (unchangedLength < 0) {
      this->errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      iVar2 = lastUnit(this);
      remaining = unchangedLength;
      if (iVar2 < 0xfff) {
        if (unchangedLength <= 0xfff - iVar2) {
          setLastUnit(this,iVar2 + unchangedLength);
          return;
        }
        setLastUnit(this,0xfff);
        remaining = unchangedLength - (0xfff - iVar2);
      }
      for (; 0xfff < remaining; remaining = remaining + -0x1000) {
        append(this,0xfff);
      }
      if (0 < remaining) {
        append(this,remaining + -1);
      }
    }
  }
  return;
}

Assistant:

void Edits::addUnchanged(int32_t unchangedLength) {
    if(U_FAILURE(errorCode_) || unchangedLength == 0) { return; }
    if(unchangedLength < 0) {
        errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    // Merge into previous unchanged-text record, if any.
    int32_t last = lastUnit();
    if(last < MAX_UNCHANGED) {
        int32_t remaining = MAX_UNCHANGED - last;
        if (remaining >= unchangedLength) {
            setLastUnit(last + unchangedLength);
            return;
        }
        setLastUnit(MAX_UNCHANGED);
        unchangedLength -= remaining;
    }
    // Split large lengths into multiple units.
    while(unchangedLength >= MAX_UNCHANGED_LENGTH) {
        append(MAX_UNCHANGED);
        unchangedLength -= MAX_UNCHANGED_LENGTH;
    }
    // Write a small (remaining) length.
    if(unchangedLength > 0) {
        append(unchangedLength - 1);
    }
}